

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O1

void helicsMessageSetTime(HelicsMessage message,HelicsTime time,HelicsError *err)

{
  long *plVar1;
  long lVar2;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (message == (HelicsMessage)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001afd9a;
    }
    else {
      plVar1 = (long *)0x0;
      if (*(short *)((long)message + 10) == 0xb3) {
        plVar1 = (long *)message;
      }
      if (*(short *)((long)message + 10) == 0xb3 || err == (HelicsError *)0x0) goto LAB_001afd9c;
    }
    err->error_code = -4;
    err->message = "The message object was not valid";
  }
LAB_001afd9a:
  plVar1 = (long *)0x0;
LAB_001afd9c:
  if (plVar1 != (long *)0x0) {
    lVar2 = 0x7fffffffffffffff;
    if (time <= -9223372036.854765) {
      lVar2 = -0x7fffffffffffffff;
    }
    else if (time < 9223372036.854765) {
      lVar2 = (long)(time * 1000000000.0 +
                    *(double *)(&DAT_00436020 + (ulong)(0.0 <= time * 1000000000.0) * 8));
    }
    *plVar1 = lVar2;
  }
  return;
}

Assistant:

helics::Message* getMessageObj(HelicsMessage message, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    auto* mess = reinterpret_cast<helics::Message*>(message);
    if (mess == nullptr || mess->messageValidation != messageKeyCode) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidMessageObject);
        return nullptr;
    }
    return mess;
}